

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::clara::detail::Opt::isMatch(Opt *this,string *optToken)

{
  pointer pcVar1;
  pointer pbVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  string normalisedToken;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_70 = local_60;
  pcVar1 = (optToken->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + optToken->_M_string_length);
  pbVar4 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->m_optNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = pbVar4 != pbVar2;
  if (bVar5) {
    do {
      pcVar1 = (pbVar4->_M_dataplus)._M_p;
      local_50 = local_40;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + pbVar4->_M_string_length);
      if (local_48 == local_68) {
        if (local_48 == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_50,local_70,local_48);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (bVar6) break;
      pbVar4 = pbVar4 + 1;
      bVar5 = pbVar4 != pbVar2;
    } while (bVar5);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return bVar5;
}

Assistant:

auto isMatch( std::string const &optToken ) const -> bool {
            auto normalisedToken = normaliseOpt( optToken );
            for( auto const &name : m_optNames ) {
                if( normaliseOpt( name ) == normalisedToken )
                    return true;
            }
            return false;
        }